

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void fetchTransformed_fetcher<(TextureBlendType)2,(QPixelLayout::BPP)4,unsigned_int>
               (uint *buffer,QSpanData *data,int y,int x,int length)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  QTextureData *this;
  uchar *puVar8;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  uint *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  double dVar11;
  qreal ty;
  qreal tx;
  qreal iw;
  uint *b;
  uint *end;
  qreal fw;
  qreal fy_1;
  qreal fx_1;
  qreal fdw;
  qreal fdy_1;
  qreal fdx_1;
  int py_1;
  int px_2;
  int y2;
  int x2_1;
  int i_1;
  int px;
  int x2;
  int i;
  uchar *src;
  int fy;
  int fx;
  int fdy;
  int fdx;
  Fetch1PixelFunc fetch1;
  QPixelLayout *layout;
  bool useFetch;
  qreal cy;
  qreal cx;
  QTextureData *image;
  int py_3;
  int px_4;
  int py_2;
  int px_3;
  int y1;
  int x1_1;
  int fastLen_1;
  int px_1;
  int x1;
  int fastLen;
  int py;
  int *in_stack_fffffffffffffec8;
  int *piVar12;
  undefined8 in_stack_fffffffffffffed0;
  int max;
  undefined8 in_stack_fffffffffffffed8;
  QSpanData *in_stack_fffffffffffffee8;
  qsizetype in_stack_fffffffffffffef0;
  uint *puVar13;
  qreal in_stack_fffffffffffffef8;
  qreal in_stack_ffffffffffffff00;
  double local_f8;
  int local_c8;
  int local_bc;
  int local_b0;
  int local_ac;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QTextureData *)(in_RSI + 0xa8);
  dVar9 = (double)in_ECX + 0.5;
  dVar10 = (double)in_EDX + 0.5;
  bVar4 = canUseFastMatrixPath
                    (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                     in_stack_fffffffffffffee8);
  if (bVar4) {
    iVar5 = (int)(*(double *)(in_RSI + 0x38) * 65536.0);
    iVar6 = (int)(*(double *)(in_RSI + 0x40) * 65536.0);
    local_ac = (int)((*(double *)(in_RSI + 0x50) * dVar10 + *(double *)(in_RSI + 0x38) * dVar9 +
                     *(double *)(in_RSI + 0x70)) * 65536.0);
    local_b0 = (int)((*(double *)(in_RSI + 0x58) * dVar10 + *(double *)(in_RSI + 0x40) * dVar9 +
                     *(double *)(in_RSI + 0x78)) * 65536.0);
    if (iVar6 == 0) {
      local_c = local_b0 >> 0x10;
      fetchTransformed_pixelBounds<(TextureBlendType)2>
                ((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                 (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                 in_stack_fffffffffffffec8);
      puVar8 = QTextureData::scanLine(this,local_c);
      local_bc = 0;
      if (iVar5 < 1) {
        local_10 = in_R8D;
        if (iVar5 < 0) {
          local_18 = (int)(((long)*(int *)(in_RSI + 0xb8) * 0x10000 - (long)local_ac) / (long)iVar5)
          ;
          piVar12 = qMin<int>(&local_10,&local_18);
          local_10 = *piVar12;
        }
      }
      else {
        local_14 = (int)(((long)(*(int *)(in_RSI + 0xc0) + -1) * 0x10000 - (long)local_ac) /
                        (long)iVar5);
        piVar12 = qMin<int>(&local_10,&local_14);
        local_10 = *piVar12;
      }
      for (; local_bc < local_10; local_bc = local_bc + 1) {
        local_1c = local_ac >> 0x10;
        fetchTransformed_pixelBounds<(TextureBlendType)2>
                  ((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                   in_stack_fffffffffffffec8);
        if (local_1c == local_ac >> 0x10) break;
        uVar7 = fetch1Pixel<(QPixelLayout::BPP)4>(puVar8,local_1c);
        in_RDI[local_bc] = uVar7;
        local_ac = iVar5 + local_ac;
      }
      for (; local_bc < local_10; local_bc = local_bc + 1) {
        uVar7 = fetch1Pixel<(QPixelLayout::BPP)4>(puVar8,local_ac >> 0x10);
        in_RDI[local_bc] = uVar7;
        local_ac = iVar5 + local_ac;
      }
      for (; local_bc < in_R8D; local_bc = local_bc + 1) {
        local_20 = local_ac >> 0x10;
        fetchTransformed_pixelBounds<(TextureBlendType)2>
                  ((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                   in_stack_fffffffffffffec8);
        uVar7 = fetch1Pixel<(QPixelLayout::BPP)4>(puVar8,local_20);
        in_RDI[local_bc] = uVar7;
        local_ac = iVar5 + local_ac;
      }
    }
    else {
      if (iVar5 < 1) {
        local_24 = in_R8D;
        if (iVar5 < 0) {
          local_2c = (int)(((long)*(int *)(in_RSI + 0xb8) * 0x10000 - (long)local_ac) / (long)iVar5)
          ;
          piVar12 = qMin<int>(&local_24,&local_2c);
          local_24 = *piVar12;
        }
      }
      else {
        local_28 = (int)(((long)(*(int *)(in_RSI + 0xc0) + -1) * 0x10000 - (long)local_ac) /
                        (long)iVar5);
        piVar12 = qMin<int>(&local_24,&local_28);
        local_24 = *piVar12;
      }
      if (iVar6 < 1) {
        if (iVar6 < 0) {
          local_34 = (int)(((long)*(int *)(in_RSI + 0xbc) * 0x10000 - (long)local_b0) / (long)iVar6)
          ;
          piVar12 = qMin<int>(&local_24,&local_34);
          local_24 = *piVar12;
        }
      }
      else {
        local_30 = (int)(((long)(*(int *)(in_RSI + 0xc4) + -1) * 0x10000 - (long)local_b0) /
                        (long)iVar6);
        piVar12 = qMin<int>(&local_24,&local_30);
        local_24 = *piVar12;
      }
      local_c8 = 0;
      if (0 < local_24) {
        fetchTransformed_pixelBounds<(TextureBlendType)2>
                  ((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                   in_stack_fffffffffffffec8);
        fetchTransformed_pixelBounds<(TextureBlendType)2>
                  ((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                   in_stack_fffffffffffffec8);
      }
      for (; local_c8 < local_24; local_c8 = local_c8 + 1) {
        puVar8 = QTextureData::scanLine(this,local_b0 >> 0x10);
        uVar7 = fetch1Pixel<(QPixelLayout::BPP)4>(puVar8,local_ac >> 0x10);
        in_RDI[local_c8] = uVar7;
        local_ac = iVar5 + local_ac;
        local_b0 = iVar6 + local_b0;
      }
      for (; local_c8 < in_R8D; local_c8 = local_c8 + 1) {
        fetchTransformed_pixelBounds<(TextureBlendType)2>
                  ((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                   in_stack_fffffffffffffec8);
        fetchTransformed_pixelBounds<(TextureBlendType)2>
                  ((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
                   in_stack_fffffffffffffec8);
        puVar8 = QTextureData::scanLine(this,local_b0 >> 0x10);
        uVar7 = fetch1Pixel<(QPixelLayout::BPP)4>(puVar8,local_ac >> 0x10);
        in_RDI[local_c8] = uVar7;
        local_ac = iVar5 + local_ac;
        local_b0 = iVar6 + local_b0;
      }
    }
  }
  else {
    dVar1 = *(double *)(in_RSI + 0x38);
    dVar2 = *(double *)(in_RSI + 0x40);
    dVar3 = *(double *)(in_RSI + 0x48);
    local_f8 = *(double *)(in_RSI + 0x50) * dVar10 + *(double *)(in_RSI + 0x38) * dVar9 +
               *(double *)(in_RSI + 0x70);
    dVar11 = *(double *)(in_RSI + 0x58) * dVar10 + *(double *)(in_RSI + 0x40) * dVar9 +
             *(double *)(in_RSI + 0x78);
    dVar9 = *(double *)(in_RSI + 0x60) * dVar10 + *(double *)(in_RSI + 0x48) * dVar9 +
            *(double *)(in_RSI + 0x68);
    puVar13 = in_RDI + in_R8D;
    for (; in_RDI < puVar13; in_RDI = in_RDI + 1) {
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        piVar12 = (int *)(1.0 / dVar9);
      }
      else {
        piVar12 = (int *)0x3ff0000000000000;
      }
      dVar10 = local_f8 * (double)piVar12;
      max = (int)((ulong)(dVar11 * (double)piVar12) >> 0x20);
      iVar5 = qFloor<double>(5.87552895567021e-317);
      iVar6 = qFloor<double>(5.87553784885183e-317);
      fetchTransformed_pixelBounds<(TextureBlendType)2>
                (max,(int)((ulong)dVar10 >> 0x20),SUB84(dVar10,0),piVar12);
      fetchTransformed_pixelBounds<(TextureBlendType)2>
                (max,(int)((ulong)dVar10 >> 0x20),SUB84(dVar10,0),piVar12);
      puVar8 = QTextureData::scanLine(this,iVar6);
      uVar7 = fetch1Pixel<(QPixelLayout::BPP)4>(puVar8,iVar5);
      *in_RDI = uVar7;
      local_f8 = dVar1 + local_f8;
      dVar11 = dVar2 + dVar11;
      dVar9 = dVar3 + dVar9;
      if ((dVar9 == 0.0) && (!NAN(dVar9))) {
        dVar9 = dVar3 + dVar9;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void QT_FASTCALL fetchTransformed_fetcher(T *buffer, const QSpanData *data,
                                                 int y, int x, int length)
{
    static_assert(blendType == BlendTransformed || blendType == BlendTransformedTiled);
    const QTextureData &image = data->texture;

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    constexpr bool useFetch = (bpp < QPixelLayout::BPP32) && sizeof(T) == sizeof(uint);
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    if (!useFetch)
        Q_ASSERT(layout->bpp == bpp || (layout->bpp == QPixelLayout::BPP16FPx4 && bpp == QPixelLayout::BPP64));
    // When templated 'fetch' should be inlined at compile time:
    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout->bpp] : Fetch1PixelFunc(fetch1Pixel<bpp>);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        if (fdy == 0) { // simple scale, no rotation or shear
            int py = (fy >> 16);
            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            const uchar *src = image.scanLine(py);

            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int x2 = x1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    if (x1 == x2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[x1];
                    fx += fdx;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[px];
                    fx += fdx;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                if constexpr (useFetch)
                    buffer[i] = fetch1(src, px);
                else
                    buffer[i] = reinterpret_cast<const T*>(src)[px];
                fx += fdx;
            }
        } else { // rotation or shear
            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));
                if (fdy > 0)
                    fastLen = qMin(fastLen, int((qint64(image.y2 - 1) * fixed_scale - fy) / fdy));
                else if (fdy < 0)
                    fastLen = qMin(fastLen, int((qint64(image.y1) * fixed_scale - fy) / fdy));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int y1 = (fy >> 16);
                    int x2 = x1;
                    int y2 = y1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1);
                    if (x1 == x2 && y1 == y2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(y1), x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(y1))[x1];
                    fx += fdx;
                    fy += fdy;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    int py = (fy >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(py), px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                    fx += fdx;
                    fy += fdy;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                int py = (fy >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
                if constexpr (useFetch)
                    buffer[i] = fetch1(image.scanLine(py), px);
                else
                    buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                fx += fdx;
                fy += fdy;
            }
        }
    } else {
        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        T *const end = buffer + length;
        T *b = buffer;
        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal tx = fx * iw;
            const qreal ty = fy * iw;
            int px = qFloor(tx);
            int py = qFloor(ty);

            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
            if constexpr (useFetch)
                *b = fetch1(image.scanLine(py), px);
            else
                *b = reinterpret_cast<const T*>(image.scanLine(py))[px];

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }
}